

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QList<QString>>>
          (QtPrivate *this,QDebug debug,char *which,QList<QList<QString>_> *c)

{
  QList<QString> *pQVar1;
  char *pcVar2;
  long lVar3;
  Stream *__old_val;
  storage_type *psVar4;
  storage_type *psVar5;
  QArrayData *this_00;
  QTextStream *pQVar6;
  QList<QString> *c_00;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QDebugStateSaver saver;
  QDebug local_78;
  QtPrivate local_70 [8];
  QDebug local_68;
  QtPrivate local_60 [8];
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar6 = *(QTextStream **)debug.stream;
  pQVar6[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar5 = (storage_type *)0x0;
  }
  else {
    psVar4 = (storage_type *)0xffffffffffffffff;
    do {
      psVar5 = psVar4 + 1;
      pcVar2 = which + 1 + (long)psVar4;
      psVar4 = psVar5;
    } while (*pcVar2 != '\0');
  }
  QVar7.m_data = psVar5;
  QVar7.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<(pQVar6,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar6 = *(QTextStream **)debug.stream;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)debug.stream;
  }
  QTextStream::operator<<(pQVar6,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  c_00 = (c->d).ptr;
  lVar3 = (c->d).size;
  pQVar1 = c_00 + lVar3;
  if (lVar3 != 0) {
    local_50[0] = *(QArrayData **)debug.stream;
    *(int *)&local_50[0][2].alloc = (int)local_50[0][2].alloc + 1;
    local_68.stream = (Stream *)0x0;
    printSequentialContainer<QList<QString>>(local_60,(Stream *)local_50,"QList",c_00);
    QDebug::~QDebug((QDebug *)local_50);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug(&local_68);
    c_00 = c_00 + 1;
  }
  if (c_00 != pQVar1) {
    do {
      pQVar6 = *(QTextStream **)debug.stream;
      QVar8.m_data = (storage_type *)0x2;
      QVar8.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<(pQVar6,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      this_00 = *(QArrayData **)debug.stream;
      if ((char)this_00[3].ref_._q_value.super___atomic_base<int>._M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)this_00,' ');
        this_00 = *(QArrayData **)debug.stream;
      }
      *(int *)&this_00[2].alloc = (int)this_00[2].alloc + 1;
      local_78.stream = (Stream *)0x0;
      local_50[0] = this_00;
      printSequentialContainer<QList<QString>>(local_70,(Stream *)local_50,"QList",c_00);
      QDebug::~QDebug((QDebug *)local_50);
      QDebug::~QDebug((QDebug *)local_70);
      QDebug::~QDebug(&local_78);
      c_00 = c_00 + 1;
    } while (c_00 != pQVar1);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  pQVar6 = *(QTextStream **)debug.stream;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)debug.stream;
  }
  *(undefined8 *)debug.stream = 0;
  *(QTextStream **)this = pQVar6;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}